

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# env.cpp
# Opt level: O2

uint64_t __thiscall nivalis::Environment::addr_of_func(Environment *this,string *func_name)

{
  const_iterator cVar1;
  uint64_t uVar2;
  
  (this->error_msg)._M_string_length = 0;
  *(this->error_msg)._M_dataplus._M_p = '\0';
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          ::find(&(this->freg)._M_t,func_name);
  if ((_Rb_tree_header *)cVar1._M_node == &(this->freg)._M_t._M_impl.super__Rb_tree_header) {
    uVar2 = 0xffffffffffffffff;
  }
  else {
    uVar2 = *(uint64_t *)(cVar1._M_node + 2);
  }
  return uVar2;
}

Assistant:

uint64_t Environment::addr_of_func(const std::string& func_name) const {
    error_msg.clear();
    auto it = freg.find(func_name);
    if (it != freg.end()) {
        return it->second;
    }
    return -1;
}